

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O1

void MD5Transform(HPDF_UINT32 *buf,HPDF_UINT32 *in)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  HPDF_UINT32 HVar4;
  HPDF_UINT32 HVar5;
  HPDF_UINT32 HVar6;
  HPDF_UINT32 HVar7;
  HPDF_UINT32 HVar8;
  HPDF_UINT32 HVar9;
  HPDF_UINT32 HVar10;
  HPDF_UINT32 HVar11;
  HPDF_UINT32 HVar12;
  HPDF_UINT32 HVar13;
  HPDF_UINT32 HVar14;
  HPDF_UINT32 HVar15;
  HPDF_UINT32 HVar16;
  HPDF_UINT32 HVar17;
  HPDF_UINT32 HVar18;
  HPDF_UINT32 HVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  uVar1 = buf[1];
  uVar2 = buf[2];
  uVar3 = buf[3];
  HVar4 = *in;
  HVar5 = in[1];
  uVar20 = ((uVar3 ^ uVar2) & uVar1 ^ uVar3) + *buf + HVar4 + 0xd76aa478;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar1;
  uVar21 = ((uVar2 ^ uVar1) & uVar20 ^ uVar2) + uVar3 + HVar5 + 0xe8c7b756;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  HVar6 = in[2];
  uVar22 = ((uVar20 ^ uVar1) & uVar21 ^ uVar1) + HVar6 + uVar2 + 0x242070db;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  HVar7 = in[3];
  uVar24 = uVar1 + HVar7 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xc1bdceee;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  HVar8 = in[4];
  uVar20 = uVar20 + HVar8 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0xf57c0faf;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  HVar9 = in[5];
  uVar21 = uVar21 + HVar9 + ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + 0x4787c62a;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  HVar10 = in[6];
  uVar22 = uVar22 + HVar10 + ((uVar20 ^ uVar24) & uVar21 ^ uVar24) + 0xa8304613;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  HVar11 = in[7];
  uVar24 = uVar24 + HVar11 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xfd469501;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  HVar12 = in[8];
  uVar20 = uVar20 + HVar12 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0x698098d8;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  HVar13 = in[9];
  uVar21 = uVar21 + HVar13 + ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + 0x8b44f7af;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  HVar14 = in[10];
  uVar22 = (uVar22 + HVar14 + ((uVar20 ^ uVar24) & uVar21 ^ uVar24)) - 0xa44f;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  HVar15 = in[0xb];
  uVar24 = ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + uVar24 + HVar15 + 0x895cd7be;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  HVar16 = in[0xc];
  uVar20 = uVar20 + HVar16 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0x6b901122;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  HVar17 = in[0xd];
  uVar21 = ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + uVar21 + HVar17 + 0xfd987193;
  uVar23 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  HVar18 = in[0xe];
  uVar21 = uVar22 + HVar18 + ((uVar20 ^ uVar24) & uVar23 ^ uVar24) + 0xa679438e;
  uVar22 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar23;
  HVar19 = in[0xf];
  uVar21 = uVar24 + HVar19 + ((uVar23 ^ uVar20) & uVar22 ^ uVar20) + 0x49b40821;
  uVar24 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar22;
  uVar20 = uVar20 + HVar5 + ((uVar24 ^ uVar22) & uVar23 ^ uVar22) + 0xf61e2562;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + uVar23 + HVar10 + 0xc040b340;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + HVar15 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0x265e5a51;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + HVar4 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0xe9b6c7aa;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + HVar9 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0xd62f105d;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + HVar14 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0x2441453;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + HVar19 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0xd8a1e681;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + HVar8 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0xe7d3fbc8;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + HVar13 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0x21e1cde6;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + HVar18 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0xc33707d6;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + HVar7 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0xf4d50d87;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + HVar12 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0x455a14ed;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + HVar17 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0xa9e3e905;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + HVar6 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0xfcefa3f8;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + HVar11 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0x676f02d9;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + HVar16 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0x8d2a4c8a;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = (uVar20 + HVar9 + (uVar22 ^ uVar21 ^ uVar24)) - 0x5c6be;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + HVar12 + (uVar24 ^ uVar22 ^ uVar20) + 0x8771f681;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + HVar15 + (uVar20 ^ uVar24 ^ uVar21) + 0x6d9d6122;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = uVar24 + HVar18 + (uVar21 ^ uVar20 ^ uVar22) + 0xfde5380c;
  uVar24 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = uVar20 + HVar5 + (uVar22 ^ uVar21 ^ uVar24) + 0xa4beea44;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + HVar8 + (uVar24 ^ uVar22 ^ uVar20) + 0x4bdecfa9;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + HVar11 + (uVar20 ^ uVar24 ^ uVar21) + 0xf6bb4b60;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = uVar24 + HVar14 + (uVar21 ^ uVar20 ^ uVar22) + 0xbebfbc70;
  uVar24 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = uVar20 + HVar17 + (uVar22 ^ uVar21 ^ uVar24) + 0x289b7ec6;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + HVar4 + (uVar24 ^ uVar22 ^ uVar20) + 0xeaa127fa;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + HVar7 + (uVar20 ^ uVar24 ^ uVar21) + 0xd4ef3085;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = (uVar21 ^ uVar20 ^ uVar22) + uVar24 + HVar10 + 0x4881d05;
  uVar23 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = (uVar22 ^ uVar21 ^ uVar23) + uVar20 + HVar13 + 0xd9d4d039;
  uVar24 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar23;
  uVar20 = (uVar23 ^ uVar22 ^ uVar24) + uVar21 + HVar16 + 0xe6db99e5;
  uVar20 = (uVar20 * 0x800 | uVar20 >> 0x15) + uVar24;
  uVar21 = (uVar24 ^ uVar23 ^ uVar20) + uVar22 + HVar19 + 0x1fa27cf8;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar20;
  uVar22 = (uVar20 ^ uVar24 ^ uVar21) + uVar23 + HVar6 + 0xc4ac5665;
  uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar21;
  uVar24 = ((~uVar20 | uVar22) ^ uVar21) + uVar24 + HVar4 + 0xf4292244;
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar22;
  uVar20 = ((~uVar21 | uVar24) ^ uVar22) + uVar20 + HVar11 + 0x432aff97;
  uVar23 = (uVar20 * 0x400 | uVar20 >> 0x16) + uVar24;
  uVar20 = uVar21 + HVar18 + ((~uVar22 | uVar23) ^ uVar24) + 0xab9423a7;
  uVar21 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar23;
  uVar20 = ((~uVar24 | uVar21) ^ uVar23) + uVar22 + HVar9 + 0xfc93a039;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = ((~uVar23 | uVar20) ^ uVar21) + uVar24 + HVar16 + 0x655b59c3;
  uVar22 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar24 = uVar23 + HVar7 + ((~uVar21 | uVar22) ^ uVar20) + 0x8f0ccc92;
  uVar23 = (uVar24 * 0x400 | uVar24 >> 0x16) + uVar22;
  uVar21 = (uVar21 + HVar14 + ((~uVar20 | uVar23) ^ uVar22)) - 0x100b83;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar23;
  uVar20 = uVar20 + HVar5 + ((~uVar22 | uVar21) ^ uVar23) + 0x85845dd1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = uVar22 + HVar12 + ((~uVar23 | uVar20) ^ uVar21) + 0x6fa87e4f;
  uVar24 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar22 = ((~uVar21 | uVar24) ^ uVar20) + uVar23 + HVar19 + 0xfe2ce6e0;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar24;
  uVar21 = uVar21 + HVar10 + ((~uVar20 | uVar22) ^ uVar24) + 0xa3014314;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + HVar17 + ((~uVar24 | uVar21) ^ uVar22) + 0x4e0811a1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar24 = ((~uVar22 | uVar20) ^ uVar21) + uVar24 + HVar8 + 0xf7537e82;
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar20;
  uVar22 = uVar22 + HVar15 + ((~uVar21 | uVar24) ^ uVar20) + 0xbd3af235;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar24;
  uVar21 = uVar21 + HVar6 + ((~uVar20 | uVar22) ^ uVar24) + 0x2ad7d2bb;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + HVar13 + ((~uVar24 | uVar21) ^ uVar22) + 0xeb86d391;
  *buf = uVar24 + *buf;
  buf[1] = uVar1 + uVar21 + (uVar20 * 0x200000 | uVar20 >> 0xb);
  buf[2] = uVar21 + uVar2;
  buf[3] = uVar22 + uVar3;
  return;
}

Assistant:

static void
MD5Transform  (HPDF_UINT32       buf[4],
               const HPDF_UINT32 in[16])
{
    register HPDF_UINT32 a, b, c, d;

    a = buf[0];
    b = buf[1];
    c = buf[2];
    d = buf[3];

    HPDF_MD5STEP (F1, a, b, c, d, in[0] + 0xd76aa478, 7);
    HPDF_MD5STEP (F1, d, a, b, c, in[1] + 0xe8c7b756, 12);
    HPDF_MD5STEP (F1, c, d, a, b, in[2] + 0x242070db, 17);
    HPDF_MD5STEP (F1, b, c, d, a, in[3] + 0xc1bdceee, 22);
    HPDF_MD5STEP (F1, a, b, c, d, in[4] + 0xf57c0faf, 7);
    HPDF_MD5STEP (F1, d, a, b, c, in[5] + 0x4787c62a, 12);
    HPDF_MD5STEP (F1, c, d, a, b, in[6] + 0xa8304613, 17);
    HPDF_MD5STEP (F1, b, c, d, a, in[7] + 0xfd469501, 22);
    HPDF_MD5STEP (F1, a, b, c, d, in[8] + 0x698098d8, 7);
    HPDF_MD5STEP (F1, d, a, b, c, in[9] + 0x8b44f7af, 12);
    HPDF_MD5STEP (F1, c, d, a, b, in[10] + 0xffff5bb1, 17);
    HPDF_MD5STEP (F1, b, c, d, a, in[11] + 0x895cd7be, 22);
    HPDF_MD5STEP (F1, a, b, c, d, in[12] + 0x6b901122, 7);
    HPDF_MD5STEP (F1, d, a, b, c, in[13] + 0xfd987193, 12);
    HPDF_MD5STEP (F1, c, d, a, b, in[14] + 0xa679438e, 17);
    HPDF_MD5STEP (F1, b, c, d, a, in[15] + 0x49b40821, 22);

    HPDF_MD5STEP (F2, a, b, c, d, in[1] + 0xf61e2562, 5);
    HPDF_MD5STEP (F2, d, a, b, c, in[6] + 0xc040b340, 9);
    HPDF_MD5STEP (F2, c, d, a, b, in[11] + 0x265e5a51, 14);
    HPDF_MD5STEP (F2, b, c, d, a, in[0] + 0xe9b6c7aa, 20);
    HPDF_MD5STEP (F2, a, b, c, d, in[5] + 0xd62f105d, 5);
    HPDF_MD5STEP (F2, d, a, b, c, in[10] + 0x02441453, 9);
    HPDF_MD5STEP (F2, c, d, a, b, in[15] + 0xd8a1e681, 14);
    HPDF_MD5STEP (F2, b, c, d, a, in[4] + 0xe7d3fbc8, 20);
    HPDF_MD5STEP (F2, a, b, c, d, in[9] + 0x21e1cde6, 5);
    HPDF_MD5STEP (F2, d, a, b, c, in[14] + 0xc33707d6, 9);
    HPDF_MD5STEP (F2, c, d, a, b, in[3] + 0xf4d50d87, 14);
    HPDF_MD5STEP (F2, b, c, d, a, in[8] + 0x455a14ed, 20);
    HPDF_MD5STEP (F2, a, b, c, d, in[13] + 0xa9e3e905, 5);
    HPDF_MD5STEP (F2, d, a, b, c, in[2] + 0xfcefa3f8, 9);
    HPDF_MD5STEP (F2, c, d, a, b, in[7] + 0x676f02d9, 14);
    HPDF_MD5STEP (F2, b, c, d, a, in[12] + 0x8d2a4c8a, 20);

    HPDF_MD5STEP (F3, a, b, c, d, in[5] + 0xfffa3942, 4);
    HPDF_MD5STEP (F3, d, a, b, c, in[8] + 0x8771f681, 11);
    HPDF_MD5STEP (F3, c, d, a, b, in[11] + 0x6d9d6122, 16);
    HPDF_MD5STEP (F3, b, c, d, a, in[14] + 0xfde5380c, 23);
    HPDF_MD5STEP (F3, a, b, c, d, in[1] + 0xa4beea44, 4);
    HPDF_MD5STEP (F3, d, a, b, c, in[4] + 0x4bdecfa9, 11);
    HPDF_MD5STEP (F3, c, d, a, b, in[7] + 0xf6bb4b60, 16);
    HPDF_MD5STEP (F3, b, c, d, a, in[10] + 0xbebfbc70, 23);
    HPDF_MD5STEP (F3, a, b, c, d, in[13] + 0x289b7ec6, 4);
    HPDF_MD5STEP (F3, d, a, b, c, in[0] + 0xeaa127fa, 11);
    HPDF_MD5STEP (F3, c, d, a, b, in[3] + 0xd4ef3085, 16);
    HPDF_MD5STEP (F3, b, c, d, a, in[6] + 0x04881d05, 23);
    HPDF_MD5STEP (F3, a, b, c, d, in[9] + 0xd9d4d039, 4);
    HPDF_MD5STEP (F3, d, a, b, c, in[12] + 0xe6db99e5, 11);
    HPDF_MD5STEP (F3, c, d, a, b, in[15] + 0x1fa27cf8, 16);
    HPDF_MD5STEP (F3, b, c, d, a, in[2] + 0xc4ac5665, 23);

    HPDF_MD5STEP (F4, a, b, c, d, in[0] + 0xf4292244, 6);
    HPDF_MD5STEP (F4, d, a, b, c, in[7] + 0x432aff97, 10);
    HPDF_MD5STEP (F4, c, d, a, b, in[14] + 0xab9423a7, 15);
    HPDF_MD5STEP (F4, b, c, d, a, in[5] + 0xfc93a039, 21);
    HPDF_MD5STEP (F4, a, b, c, d, in[12] + 0x655b59c3, 6);
    HPDF_MD5STEP (F4, d, a, b, c, in[3] + 0x8f0ccc92, 10);
    HPDF_MD5STEP (F4, c, d, a, b, in[10] + 0xffeff47d, 15);
    HPDF_MD5STEP (F4, b, c, d, a, in[1] + 0x85845dd1, 21);
    HPDF_MD5STEP (F4, a, b, c, d, in[8] + 0x6fa87e4f, 6);
    HPDF_MD5STEP (F4, d, a, b, c, in[15] + 0xfe2ce6e0, 10);
    HPDF_MD5STEP (F4, c, d, a, b, in[6] + 0xa3014314, 15);
    HPDF_MD5STEP (F4, b, c, d, a, in[13] + 0x4e0811a1, 21);
    HPDF_MD5STEP (F4, a, b, c, d, in[4] + 0xf7537e82, 6);
    HPDF_MD5STEP (F4, d, a, b, c, in[11] + 0xbd3af235, 10);
    HPDF_MD5STEP (F4, c, d, a, b, in[2] + 0x2ad7d2bb, 15);
    HPDF_MD5STEP (F4, b, c, d, a, in[9] + 0xeb86d391, 21);

    buf[0] += a;
    buf[1] += b;
    buf[2] += c;
    buf[3] += d;
}